

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

bool __thiscall
tonk::gateway::HTTPRequester::OnTick_IsDisposable(HTTPRequester *this,uint64_t nowUsec)

{
  ErrorResult *pEVar1;
  bool bVar2;
  Result result;
  Result local_48;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  bVar2 = (bool)(this->AsyncRefs < 1 & this->Done);
  if ((bVar2 == false) && (14999999 < nowUsec - this->StartUsec)) {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Connection timeout","");
    pEVar1 = (ErrorResult *)operator_new(0x38);
    pEVar1->Source = (char *)0x0;
    (pEVar1->Description)._M_dataplus._M_p = (pointer)&(pEVar1->Description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pEVar1->Description,local_40,local_40 + local_38);
    pEVar1->Type = Tonk;
    pEVar1->Code = 2;
    local_48.Error = pEVar1;
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    OnDone(this,&local_48,0,(char *)0x0,0);
    Result::~Result(&local_48);
  }
  return bVar2;
}

Assistant:

bool HTTPRequester::OnTick_IsDisposable(uint64_t nowUsec)
{
    // If requester is done and no reference remain:
    if (Done && AsyncRefs <= 0) {
        // It can be deleted now
        return true;
    }

    // Check if timeout has elapsed
    const uint64_t deltaUsec = nowUsec - StartUsec;
    if (deltaUsec >= kTimeoutUsec) {
        Result result("Connection timeout");
        OnDone(result);
    }

    // Check again on the next tick
    return false;
}